

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O1

mode_t QtPrivate::toMode_t(Permissions permissions)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)(((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                        super_QFlagsStorage<QFileDevice::Permission>.i & 0x4400) != 0) * 0x100;
  uVar2 = uVar1 + 0x80;
  if (((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
             super_QFlagsStorage<QFileDevice::Permission>.i & 0x2200) == 0) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 + 0x40;
  if (((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
             super_QFlagsStorage<QFileDevice::Permission>.i & 0x1100) == 0) {
    uVar1 = uVar2;
  }
  uVar2 = (uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                super_QFlagsStorage<QFileDevice::Permission>.i >> 1;
  return uVar2 & 0x20 |
         (uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
               super_QFlagsStorage<QFileDevice::Permission>.i & 7 | uVar2 & 0x10 | uVar2 & 8 | uVar1
  ;
}

Assistant:

constexpr inline QFlags operator&(QFlags other) const noexcept { return QFlags(std::in_place, i & other.i); }